

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall btMultiBodyDynamicsWorld::applyGravity(btMultiBodyDynamicsWorld *this)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btMultiBody *this_00;
  long lVar5;
  bool bVar6;
  long lVar7;
  int i;
  long lVar8;
  long lVar9;
  bool bVar10;
  btScalar bVar11;
  btVector3 local_40;
  
  btDiscreteDynamicsWorld::applyGravity(&this->super_btDiscreteDynamicsWorld);
  CProfileManager::Start_Profile("btMultiBody addGravity");
  if (0 < (this->m_multiBodies).m_size) {
    lVar9 = 0;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar9];
      if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
      }
      lVar7 = (long)(this_00->m_links).m_size;
      if (0 < lVar7) {
        lVar8 = 0;
        bVar6 = bVar10;
        do {
          lVar5 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar8 + 0x1c);
          if ((lVar5 != 0) && (bVar10 = bVar6, *(int *)(lVar5 + 0xec) == 2)) {
            bVar6 = true;
            bVar10 = true;
          }
          lVar8 = lVar8 + 600;
        } while (lVar7 * 600 - lVar8 != 0);
      }
      if (!bVar10) {
        fVar1 = this_00->m_baseMass;
        fVar2 = (this->super_btDiscreteDynamicsWorld).m_gravity.m_floats[2];
        uVar3 = *(undefined8 *)(this->super_btDiscreteDynamicsWorld).m_gravity.m_floats;
        uVar4 = *(undefined8 *)(this_00->m_baseForce).m_floats;
        *(ulong *)(this_00->m_baseForce).m_floats =
             CONCAT44((float)((ulong)uVar4 >> 0x20) + fVar1 * (float)((ulong)uVar3 >> 0x20),
                      (float)uVar4 + fVar1 * (float)uVar3);
        (this_00->m_baseForce).m_floats[2] = fVar2 * fVar1 + (this_00->m_baseForce).m_floats[2];
        if (0 < (this_00->m_links).m_size) {
          i = 0;
          do {
            bVar11 = btMultiBody::getLinkMass(this_00,i);
            uVar3 = *(undefined8 *)(this->super_btDiscreteDynamicsWorld).m_gravity.m_floats;
            local_40.m_floats[1] = bVar11 * (float)((ulong)uVar3 >> 0x20);
            local_40.m_floats[0] = bVar11 * (float)uVar3;
            local_40.m_floats[2] =
                 bVar11 * (this->super_btDiscreteDynamicsWorld).m_gravity.m_floats[2];
            local_40.m_floats[3] = 0.0;
            btMultiBody::addLinkForce(this_00,i,&local_40);
            i = i + 1;
          } while (i < (this_00->m_links).m_size);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::applyGravity()
{
        btDiscreteDynamicsWorld::applyGravity();
#ifdef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
        BT_PROFILE("btMultiBody addGravity");
        for (int i=0;i<this->m_multiBodies.size();i++)
        {
                btMultiBody* bod = m_multiBodies[i];

                bool isSleeping = false;

                if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                {
                        isSleeping = true;
                }
                for (int b=0;b<bod->getNumLinks();b++)
                {
                        if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                isSleeping = true;
                }

                if (!isSleeping)
                {
                        bod->addBaseForce(m_gravity * bod->getBaseMass());

                        for (int j = 0; j < bod->getNumLinks(); ++j)
                        {
                                bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
                        }
                }//if (!isSleeping)
        }
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
}